

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunk.c
# Opt level: O0

nng_err chunk_ingest_trailercr(nni_http_chunks *cl,char c)

{
  char c_local;
  nni_http_chunks *cl_local;
  
  if (c == '\n') {
    if (cl->cl_line == 0) {
      cl->cl_state = CS_DONE;
      cl_local._4_4_ = NNG_OK;
    }
    else {
      cl->cl_line = 0;
      cl->cl_state = CS_TRLR;
      cl_local._4_4_ = NNG_OK;
    }
  }
  else {
    cl_local._4_4_ = NNG_EPROTO;
  }
  return cl_local._4_4_;
}

Assistant:

static nng_err
chunk_ingest_trailercr(nni_http_chunks *cl, char c)
{
	if (c != '\n') {
		return (NNG_EPROTO);
	}
	if (cl->cl_line == 0) {
		cl->cl_state = CS_DONE;
		return (0);
	}
	cl->cl_line  = 0;
	cl->cl_state = CS_TRLR;
	return (NNG_OK);
}